

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.h
# Opt level: O0

void __thiscall sptk::StatisticsAccumulation::Buffer::Buffer(Buffer *this)

{
  undefined8 *in_RDI;
  int in_stack_0000001c;
  
  *in_RDI = &PTR__Buffer_00130b80;
  *(undefined4 *)(in_RDI + 1) = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107011);
  SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)this,in_stack_0000001c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107031);
  return;
}

Assistant:

Buffer() : zeroth_order_statistics_(0) {
    }